

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::ParseSimpleFile
               (string_view path,LineConsumer *line_consumer,string *out_error)

{
  bool bVar1;
  int file_descriptor;
  int *piVar2;
  char *p;
  AlphaNum *in_R9;
  string_view stream_name;
  string_view path_local;
  FileInputStream file_stream;
  AlphaNum local_e0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  do {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&file_stream,&path_local,(allocator<char> *)&local_e0);
    file_descriptor =
         open((char *)file_stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream,0);
    std::__cxx11::string::~string((string *)&file_stream);
    if (-1 < file_descriptor) {
      io::FileInputStream::FileInputStream(&file_stream,file_descriptor,-1);
      file_stream.copying_input_.close_on_delete_ = true;
      stream_name._M_str = (char *)line_consumer;
      stream_name._M_len = (size_t)path_local._M_str;
      bVar1 = ParseSimpleStream((objectivec *)&file_stream,(ZeroCopyInputStream *)path_local._M_len,
                                stream_name,(LineConsumer *)out_error,(string *)in_R9);
      io::FileInputStream::~FileInputStream(&file_stream);
      return bVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  file_stream._0_16_ = absl::lts_20250127::NullSafeStringView("error: Unable to open \"");
  local_e0.piece_._M_len = path_local._M_len;
  local_e0.piece_._M_str = path_local._M_str;
  local_60.piece_ = absl::lts_20250127::NullSafeStringView("\", ");
  p = strerror(*piVar2);
  local_90.piece_ = absl::lts_20250127::NullSafeStringView(p);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b0,(lts_20250127 *)&file_stream,&local_e0,&local_60,&local_90,in_R9);
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return false;
}

Assistant:

bool ParseSimpleFile(absl::string_view path, LineConsumer* line_consumer,
                     std::string* out_error) {
  int fd;
  do {
    fd = posix::open(std::string(path).c_str(), O_RDONLY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    *out_error =
        absl::StrCat("error: Unable to open \"", path, "\", ", strerror(errno));
    return false;
  }
  io::FileInputStream file_stream(fd);
  file_stream.SetCloseOnDelete(true);

  return ParseSimpleStream(file_stream, path, line_consumer, out_error);
}